

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::PatchInitValue<false,Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  bool bVar1;
  int iVar2;
  ScriptContext *requestContext;
  Type *typeWithoutProperty_00;
  Type *typeWithoutProperty;
  PropertyValueInfo info;
  PropertyOperationFlags flags;
  ScriptContext *scriptContext;
  Var newValue_local;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  PolymorphicInlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  if (newValue == (Var)0x0) {
    info.isFunctionPIC = true;
    info.allowResizingPolymorphicInlineCache = false;
    info._62_2_ = 0;
  }
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&typeWithoutProperty);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&typeWithoutProperty,functionBody,inlineCache,inlineCacheIndex,
             true);
  bVar1 = CacheOperators::TrySetProperty<true,true,false,true,true,false,true,false>
                    (object,false,propertyId,newValue,requestContext,info._60_4_,
                     (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&typeWithoutProperty);
  if (!bVar1) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
    if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
      CacheOperators::TraceCache(inlineCache,L"PatchInitValue",propertyId,requestContext,object);
    }
    typeWithoutProperty_00 = RecyclableObject::GetType(object);
    bVar1 = ParseableFunctionInfo::IsEval(&functionBody->super_ParseableFunctionInfo);
    if ((bVar1) &&
       (iVar2 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x1b])
                          (object,(ulong)(uint)propertyId,newValue,(ulong)(uint)info._60_4_,
                           &typeWithoutProperty), iVar2 != 0)) {
      CacheOperators::CachePropertyWrite
                (object,false,typeWithoutProperty_00,propertyId,
                 (PropertyValueInfo *)&typeWithoutProperty,requestContext);
    }
    else {
      iVar2 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x1a])
                        (object,(ulong)(uint)propertyId,newValue,(ulong)(uint)info._60_4_,
                         &typeWithoutProperty);
      if (iVar2 != 0) {
        CacheOperators::CachePropertyWrite
                  (object,false,typeWithoutProperty_00,propertyId,
                   (PropertyValueInfo *)&typeWithoutProperty,requestContext);
      }
    }
  }
  return;
}

Assistant:

inline void JavascriptOperators::PatchInitValue(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchInitValue);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        const PropertyOperationFlags flags = newValue == NULL ? PropertyOperation_SpecialValue : PropertyOperation_None;
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<true, true, false, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                object, false, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchInitValue"), propertyId, scriptContext, object);
        }
#endif

        Type *typeWithoutProperty = object->GetType();

        if (functionBody->IsEval())
        {
            if (object->InitPropertyInEval(propertyId, newValue, flags, &info))
            {
                CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, scriptContext);
                return;
            }
        }

        // Ideally the lowerer would emit a call to the right flavor of PatchInitValue, so that we can ensure that we only
        // ever initialize to NULL in the right cases.  But the backend uses the StFld opcode for initialization, and it
        // would be cumbersome to thread the different helper calls all the way down
        if (object->InitProperty(propertyId, newValue, flags, &info))
        {
            CacheOperators::CachePropertyWrite(object, false, typeWithoutProperty, propertyId, &info, scriptContext);
        }
        JIT_HELPER_END(Op_PatchInitValue);
    }